

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O2

void __thiscall despot::BaseRockSample::PrintAction(BaseRockSample *this)

{
  ostream *poVar1;
  ostream *in_RDX;
  int in_ESI;
  
  if (in_ESI < 4) {
    poVar1 = std::operator<<(in_RDX,(string *)
                                    (&Compass::CompassString_abi_cxx11_ + (long)in_ESI * 4));
  }
  else if (in_ESI == 4) {
    poVar1 = std::operator<<(in_RDX,"Sample");
  }
  else {
    poVar1 = std::operator<<(in_RDX,"Check ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,in_ESI + -5);
  }
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void BaseRockSample::PrintAction(ACT_TYPE action, ostream& out) const {
	if (action < E_SAMPLE)
		out << Compass::CompassString[action] << endl;
	if (action == E_SAMPLE)
		out << "Sample" << endl;
	if (action > E_SAMPLE)
		out << "Check " << (action - E_SAMPLE - 1) << endl;
}